

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_dot_pack8.h
# Opt level: O3

void ncnn::convolution_winograd_dot_pack8_avx
               (Mat *bottom_blob_tm,int outch,Mat *kernel_tm,Mat *top_blob_tm,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint _w;
  uint _c;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  float *pfVar24;
  long lVar25;
  undefined1 (*pauVar26) [32];
  int iVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  long lVar31;
  void *pvVar32;
  ulong uVar33;
  undefined1 (*pauVar34) [32];
  float *pfVar35;
  ulong uVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [32];
  ulong local_a8;
  undefined1 local_88 [64];
  size_t local_48;
  Mat *local_40;
  ulong local_38;
  
  _w = bottom_blob_tm->w;
  uVar36 = (ulong)(int)_w;
  _c = bottom_blob_tm->h;
  iVar5 = bottom_blob_tm->c;
  local_48 = 0;
  local_88._0_8_ = (Allocator *)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_88._24_4_ = 0;
  local_88._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if ((long)uVar36 < 0xc) {
    if ((int)_w < 8) {
      if ((int)_w < 4) {
        uVar28 = _w;
        iVar27 = iVar5;
        if (1 < (int)_w) {
          iVar27 = iVar5 * 2;
          uVar28 = (_w & 1) + 1;
        }
      }
      else {
        uVar28 = (_w & 1) + 1 + (uint)((_w >> 1 & 1) != 0);
        iVar27 = iVar5 * 4;
      }
    }
    else {
      uVar28 = (_w & 1) + 1 + (_w >> 2 & 1) + (uint)((_w >> 1 & 1) != 0);
      iVar27 = iVar5 * 8;
    }
  }
  else {
    uVar28 = _w % 0xc;
    uVar28 = (uVar28 & 1) + (uVar28 >> 3) + _w / 0xc + (uVar28 >> 2 & 1) +
             (uint)((uVar28 >> 1 & 1) != 0);
    iVar27 = iVar5 * 0xc;
  }
  local_88._32_8_ = local_88._0_8_;
  local_88._40_4_ = local_88._8_4_;
  local_88._44_4_ = local_88._12_4_;
  local_40 = kernel_tm;
  Mat::create((Mat *)local_88,iVar27,uVar28,_c,0x20,8,opt->workspace_allocator);
  if (0 < (int)_c) {
    uVar29 = 0;
    do {
      lVar31 = local_48 * uVar29 * local_88._16_8_;
      lVar20 = (long)(int)local_88._44_4_;
      uVar33 = 0;
      if (0xb < (int)_w) {
        uVar33 = 0;
        do {
          iVar27 = (int)uVar33;
          if (0 < iVar5) {
            pauVar34 = (undefined1 (*) [32])
                       ((ulong)((_w * (int)uVar29 + iVar27) * 8) * 4 + (long)bottom_blob_tm->data);
            pauVar26 = (undefined1 (*) [32])
                       ((long)(_func_int ***)local_88._0_8_ +
                       (uVar33 / 0xc) * local_88._16_8_ * lVar20 + lVar31);
            iVar18 = iVar5;
            do {
              auVar46 = vunpcklps_avx(*pauVar34,pauVar34[1]);
              auVar52 = vunpckhps_avx(*pauVar34,pauVar34[1]);
              auVar78 = vunpcklps_avx(pauVar34[2],pauVar34[3]);
              auVar51 = vunpckhps_avx(pauVar34[2],pauVar34[3]);
              auVar90 = vunpcklps_avx(pauVar34[4],pauVar34[5]);
              auVar45 = vunpckhps_avx(pauVar34[4],pauVar34[5]);
              auVar68 = vunpcklps_avx(pauVar34[6],pauVar34[7]);
              auVar56 = vunpckhps_avx(pauVar34[6],pauVar34[7]);
              auVar79 = vunpcklps_avx(pauVar34[8],pauVar34[9]);
              auVar63 = vunpckhps_avx(pauVar34[8],pauVar34[9]);
              auVar82 = vunpcklps_avx(pauVar34[10],pauVar34[0xb]);
              auVar60 = vunpckhps_avx(pauVar34[10],pauVar34[0xb]);
              auVar67 = vunpcklpd_avx(auVar46,auVar78);
              auVar46 = vunpckhpd_avx(auVar46,auVar78);
              auVar78 = vunpcklpd_avx(auVar52,auVar51);
              auVar52 = vunpckhpd_avx(auVar52,auVar51);
              auVar72 = vunpcklpd_avx(auVar90,auVar68);
              auVar51 = vunpckhpd_avx(auVar90,auVar68);
              auVar90 = vunpcklpd_avx(auVar45,auVar56);
              auVar45 = vunpckhpd_avx(auVar45,auVar56);
              auVar68 = vunpcklpd_avx(auVar79,auVar82);
              auVar56 = vunpckhpd_avx(auVar79,auVar82);
              auVar79 = vunpcklpd_avx(auVar63,auVar60);
              auVar63 = vunpckhpd_avx(auVar63,auVar60);
              auVar82._16_16_ = auVar72._0_16_;
              auVar82._0_16_ = auVar67._0_16_;
              auVar60 = vperm2f128_avx(auVar67,auVar72,0x31);
              auVar86._16_16_ = auVar46._0_16_;
              auVar86._0_16_ = auVar68._0_16_;
              auVar46 = vperm2f128_avx(auVar68,auVar46,0x31);
              auVar67._16_16_ = auVar56._0_16_;
              auVar67._0_16_ = auVar51._0_16_;
              auVar51 = vperm2f128_avx(auVar51,auVar56,0x31);
              auVar72._16_16_ = auVar90._0_16_;
              auVar72._0_16_ = auVar78._0_16_;
              auVar56 = vperm2f128_avx(auVar78,auVar90,0x31);
              auVar90._16_16_ = auVar52._0_16_;
              auVar90._0_16_ = auVar79._0_16_;
              auVar52 = vperm2f128_avx(auVar79,auVar52,0x31);
              auVar78._16_16_ = auVar63._0_16_;
              auVar78._0_16_ = auVar45._0_16_;
              auVar45 = vperm2f128_avx(auVar45,auVar63,0x31);
              *pauVar26 = auVar82;
              pauVar26[1] = auVar86;
              pauVar26[2] = auVar67;
              pauVar26[3] = auVar72;
              pauVar26[4] = auVar90;
              pauVar26[5] = auVar78;
              pauVar26[6] = auVar60;
              pauVar26[7] = auVar46;
              pauVar26[8] = auVar51;
              pauVar26[9] = auVar56;
              pauVar26[10] = auVar52;
              pauVar26[0xb] = auVar45;
              pauVar34 = pauVar34 + bottom_blob_tm->cstep;
              pauVar26 = pauVar26 + 0xc;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          uVar33 = uVar33 + 0xc;
        } while (iVar27 + 0x17 < (int)_w);
      }
      if ((int)uVar33 + 7 < (int)_w) {
        uVar23 = (long)(int)uVar33;
        do {
          if (0 < iVar5) {
            pauVar26 = (undefined1 (*) [32])
                       ((uVar23 + uVar29 * uVar36) * 0x20 + (long)bottom_blob_tm->data);
            pauVar34 = (undefined1 (*) [32])
                       ((long)(_func_int ***)local_88._0_8_ +
                       (ulong)(((uint)((int)uVar23 + (int)((uVar23 & 0xffffffff) / 0xc) * -0xc) >> 3
                               ) + (int)((uVar23 & 0xffffffff) / 0xc)) * local_88._16_8_ * lVar20 +
                       lVar31);
            iVar27 = iVar5;
            do {
              auVar46 = vunpcklps_avx(*pauVar26,pauVar26[1]);
              auVar52 = vunpckhps_avx(*pauVar26,pauVar26[1]);
              auVar60 = vunpcklps_avx(pauVar26[2],pauVar26[3]);
              auVar51 = vunpckhps_avx(pauVar26[2],pauVar26[3]);
              auVar78 = vunpcklps_avx(pauVar26[4],pauVar26[5]);
              auVar45 = vunpckhps_avx(pauVar26[4],pauVar26[5]);
              auVar72 = vunpcklps_avx(pauVar26[6],pauVar26[7]);
              auVar56 = vunpckhps_avx(pauVar26[6],pauVar26[7]);
              auVar63 = vunpcklpd_avx(auVar46,auVar60);
              auVar46 = vunpckhpd_avx(auVar46,auVar60);
              auVar60 = vunpcklpd_avx(auVar52,auVar51);
              auVar52 = vunpckhpd_avx(auVar52,auVar51);
              auVar67 = vunpcklpd_avx(auVar78,auVar72);
              auVar51 = vunpckhpd_avx(auVar78,auVar72);
              auVar78 = vunpcklpd_avx(auVar45,auVar56);
              auVar45 = vunpckhpd_avx(auVar45,auVar56);
              auVar68._16_16_ = auVar67._0_16_;
              auVar68._0_16_ = auVar63._0_16_;
              auVar79._16_16_ = auVar51._0_16_;
              auVar79._0_16_ = auVar46._0_16_;
              auVar83._16_16_ = auVar78._0_16_;
              auVar83._0_16_ = auVar60._0_16_;
              auVar87._16_16_ = auVar45._0_16_;
              auVar87._0_16_ = auVar52._0_16_;
              auVar56 = vperm2f128_avx(auVar63,auVar67,0x31);
              auVar46 = vperm2f128_avx(auVar46,auVar51,0x31);
              auVar51 = vperm2f128_avx(auVar60,auVar78,0x31);
              auVar52 = vperm2f128_avx(auVar52,auVar45,0x31);
              *pauVar34 = auVar68;
              pauVar34[1] = auVar79;
              pauVar34[2] = auVar83;
              pauVar34[3] = auVar87;
              pauVar34[4] = auVar56;
              pauVar34[5] = auVar46;
              pauVar34[6] = auVar51;
              pauVar34[7] = auVar52;
              pauVar26 = pauVar26 + bottom_blob_tm->cstep;
              pauVar34 = pauVar34 + 8;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          uVar33 = uVar23 + 8;
          bVar10 = (long)uVar23 < (long)(uVar36 - 0xf);
          uVar23 = uVar33;
        } while (bVar10);
      }
      if ((int)((uint)uVar33 | 3) < (int)_w) {
        uVar23 = (long)(int)(uint)uVar33;
        do {
          if (0 < iVar5) {
            pauVar26 = (undefined1 (*) [32])
                       ((uVar23 + uVar29 * uVar36) * 0x20 + (long)bottom_blob_tm->data);
            uVar28 = (int)uVar23 + (int)((uVar23 & 0xffffffff) / 0xc) * -0xc;
            pauVar34 = (undefined1 (*) [32])
                       ((long)(_func_int ***)local_88._0_8_ +
                       (ulong)((uVar28 >> 3) + (int)((uVar23 & 0xffffffff) / 0xc) +
                              (uint)((uVar28 >> 2 & 1) != 0)) * local_88._16_8_ * lVar20 + lVar31);
            iVar27 = iVar5;
            do {
              auVar46 = vunpcklps_avx(*pauVar26,pauVar26[1]);
              auVar52 = vunpckhps_avx(*pauVar26,pauVar26[1]);
              auVar56 = vunpcklps_avx(pauVar26[2],pauVar26[3]);
              auVar51 = vunpckhps_avx(pauVar26[2],pauVar26[3]);
              auVar45 = vunpcklpd_avx(auVar46,auVar56);
              auVar46 = vunpckhpd_avx(auVar46,auVar56);
              auVar56 = vunpcklpd_avx(auVar52,auVar51);
              auVar52 = vunpckhpd_avx(auVar52,auVar51);
              auVar51._16_16_ = auVar46._0_16_;
              auVar51._0_16_ = auVar45._0_16_;
              auVar63._16_16_ = auVar52._0_16_;
              auVar63._0_16_ = auVar56._0_16_;
              auVar46 = vperm2f128_avx(auVar45,auVar46,0x31);
              auVar52 = vperm2f128_avx(auVar56,auVar52,0x31);
              *pauVar34 = auVar51;
              pauVar34[1] = auVar63;
              pauVar34[2] = auVar46;
              pauVar34[3] = auVar52;
              pauVar26 = pauVar26 + bottom_blob_tm->cstep;
              pauVar34 = pauVar34 + 4;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          uVar33 = uVar23 + 4;
          lVar22 = uVar23 + 7;
          uVar23 = uVar33;
        } while (lVar22 < (long)uVar36);
      }
      if ((int)((uint)uVar33 | 1) < (int)_w) {
        uVar23 = (long)(int)(uint)uVar33;
        do {
          if (0 < iVar5) {
            pauVar26 = (undefined1 (*) [32])
                       ((uVar23 + uVar29 * uVar36) * 0x20 + (long)bottom_blob_tm->data);
            uVar28 = (int)uVar23 + (int)((uVar23 & 0xffffffff) / 0xc) * -0xc;
            pauVar34 = (undefined1 (*) [32])
                       ((long)(_func_int ***)local_88._0_8_ +
                       (ulong)((uVar28 >> 2 & 1) +
                               (uVar28 >> 3) + (int)((uVar23 & 0xffffffff) / 0xc) +
                              (uint)((uVar28 >> 1 & 1) != 0)) * local_88._16_8_ * lVar20 + lVar31);
            iVar27 = iVar5;
            do {
              auVar52 = vunpcklps_avx(*pauVar26,pauVar26[1]);
              auVar46 = vunpckhps_avx(*pauVar26,pauVar26[1]);
              auVar45._16_16_ = auVar46._0_16_;
              auVar45._0_16_ = auVar52._0_16_;
              auVar46 = vperm2f128_avx(auVar52,auVar46,0x31);
              *pauVar34 = auVar45;
              pauVar34[1] = auVar46;
              pauVar26 = pauVar26 + bottom_blob_tm->cstep;
              pauVar34 = pauVar34 + 2;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          uVar33 = uVar23 + 2;
          lVar22 = uVar23 + 3;
          uVar23 = uVar33;
        } while (lVar22 < (long)uVar36);
      }
      if ((int)uVar33 < (int)_w) {
        uVar33 = (ulong)(int)uVar33;
        do {
          if (0 < iVar5) {
            pauVar26 = (undefined1 (*) [32])
                       ((uVar33 + uVar29 * uVar36) * 0x20 + (long)bottom_blob_tm->data);
            uVar28 = (int)uVar33 + (int)((uVar33 & 0xffffffff) / 0xc) * -0xc;
            pauVar34 = (undefined1 (*) [32])
                       ((long)(_func_int ***)local_88._0_8_ +
                       (ulong)((uVar28 >> 2 & 1) +
                               (uVar28 & 1) + (uVar28 >> 3) + (int)((uVar33 & 0xffffffff) / 0xc) +
                              (uint)((uVar28 >> 1 & 1) != 0)) * local_88._16_8_ * lVar20 + lVar31);
            iVar27 = iVar5;
            do {
              *pauVar34 = *pauVar26;
              pauVar34 = pauVar34 + 1;
              pauVar26 = pauVar26 + bottom_blob_tm->cstep;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar36);
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != _c);
  }
  piVar6 = bottom_blob_tm->refcount;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (bottom_blob_tm->allocator == (Allocator *)0x0) {
        if (bottom_blob_tm->data != (void *)0x0) {
          free(bottom_blob_tm->data);
        }
      }
      else {
        (*bottom_blob_tm->allocator->_vptr_Allocator[3])();
      }
    }
  }
  bottom_blob_tm->cstep = 0;
  *(undefined4 *)&bottom_blob_tm->data = 0;
  *(undefined4 *)((long)&bottom_blob_tm->data + 4) = 0;
  *(undefined4 *)&bottom_blob_tm->refcount = 0;
  *(undefined4 *)((long)&bottom_blob_tm->refcount + 4) = 0;
  *(undefined4 *)((long)&bottom_blob_tm->refcount + 4) = 0;
  *(undefined4 *)&bottom_blob_tm->elemsize = 0;
  *(undefined4 *)((long)&bottom_blob_tm->elemsize + 4) = 0;
  bottom_blob_tm->elempack = 0;
  *(undefined4 *)&bottom_blob_tm->allocator = 0;
  *(undefined4 *)((long)&bottom_blob_tm->allocator + 4) = 0;
  bottom_blob_tm->dims = 0;
  bottom_blob_tm->w = 0;
  bottom_blob_tm->w = 0;
  bottom_blob_tm->h = 0;
  bottom_blob_tm->d = 0;
  bottom_blob_tm->c = 0;
  Mat::create(top_blob_tm,_w,_c,outch,0x20,8,opt->workspace_allocator);
  if (0 < outch) {
    iVar27 = 1;
    if (1 < iVar5 * 8) {
      iVar27 = iVar5 * 8;
    }
    local_38 = (ulong)(uint)outch;
    local_a8 = 0;
    do {
      if (0 < (int)_c) {
        sVar7 = local_40->cstep;
        pvVar8 = local_40->data;
        sVar9 = local_40->elemsize;
        lVar20 = (long)local_40->w * sVar9;
        pauVar26 = (undefined1 (*) [32])
                   (top_blob_tm->cstep * local_a8 * top_blob_tm->elemsize + (long)top_blob_tm->data)
        ;
        pvVar32 = (void *)(sVar7 * sVar9 * local_a8 + (long)pvVar8);
        uVar36 = 0;
        do {
          lVar31 = local_48 * uVar36;
          uVar29 = 0;
          lVar22 = (long)(int)local_88._44_4_;
          if (0xb < (int)_w) {
            uVar33 = 0;
            do {
              if (iVar5 < 1) {
                auVar46 = SUB6432(ZEXT864(0),0);
                fVar37 = 0.0;
                fVar38 = 0.0;
                fVar39 = 0.0;
                fVar40 = 0.0;
                fVar41 = 0.0;
                fVar42 = 0.0;
                fVar43 = 0.0;
                fVar44 = 0.0;
                auVar52 = SUB6432(ZEXT864(0),0);
                auVar56 = SUB6432(ZEXT864(0),0);
                auVar60 = SUB6432(ZEXT864(0),0);
                auVar64 = SUB6432(ZEXT864(0),0);
                auVar69 = SUB6432(ZEXT864(0),0);
                auVar76 = SUB6432(ZEXT864(0),0);
                auVar80 = SUB6432(ZEXT864(0),0);
                auVar84 = SUB6432(ZEXT864(0),0);
                auVar88 = SUB6432(ZEXT864(0),0);
                auVar73 = SUB6432(ZEXT864(0),0);
              }
              else {
                pfVar24 = (float *)((long)(_func_int ***)local_88._0_8_ +
                                   (uVar33 / 0xc) * local_88._16_8_ * lVar22 +
                                   lVar31 * local_88._16_8_);
                auVar75 = ZEXT864(0);
                auVar89 = ZEXT864(0);
                auVar85 = ZEXT864(0);
                auVar81 = ZEXT864(0);
                auVar77 = ZEXT864(0);
                auVar71 = ZEXT864(0);
                auVar66 = ZEXT864(0);
                auVar62 = ZEXT864(0);
                auVar59 = ZEXT864(0);
                auVar55 = ZEXT864(0);
                fVar37 = 0.0;
                fVar38 = 0.0;
                fVar39 = 0.0;
                fVar40 = 0.0;
                fVar41 = 0.0;
                fVar42 = 0.0;
                fVar43 = 0.0;
                fVar44 = 0.0;
                auVar50 = ZEXT864(0);
                pfVar35 = (float *)((long)pvVar8 + lVar20 * uVar36 + sVar7 * local_a8 * sVar9);
                iVar18 = iVar27;
                do {
                  fVar1 = *pfVar24;
                  fVar2 = pfVar24[1];
                  fVar11 = *pfVar35;
                  fVar12 = pfVar35[1];
                  fVar13 = pfVar35[2];
                  fVar14 = pfVar35[3];
                  fVar15 = pfVar35[4];
                  fVar16 = pfVar35[5];
                  fVar17 = pfVar35[6];
                  auVar73._0_4_ = fVar1 * fVar11 + auVar75._0_4_;
                  auVar73._4_4_ = fVar1 * fVar12 + auVar75._4_4_;
                  auVar73._8_4_ = fVar1 * fVar13 + auVar75._8_4_;
                  auVar73._12_4_ = fVar1 * fVar14 + auVar75._12_4_;
                  auVar73._16_4_ = fVar1 * fVar15 + auVar75._16_4_;
                  auVar73._20_4_ = fVar1 * fVar16 + auVar75._20_4_;
                  auVar73._24_4_ = fVar1 * fVar17 + auVar75._24_4_;
                  auVar73._28_4_ = fVar1 + auVar75._28_4_;
                  auVar75 = ZEXT3264(auVar73);
                  fVar3 = pfVar24[2];
                  fVar4 = pfVar24[3];
                  auVar88._0_4_ = fVar2 * fVar11 + auVar89._0_4_;
                  auVar88._4_4_ = fVar2 * fVar12 + auVar89._4_4_;
                  auVar88._8_4_ = fVar2 * fVar13 + auVar89._8_4_;
                  auVar88._12_4_ = fVar2 * fVar14 + auVar89._12_4_;
                  auVar88._16_4_ = fVar2 * fVar15 + auVar89._16_4_;
                  auVar88._20_4_ = fVar2 * fVar16 + auVar89._20_4_;
                  auVar88._24_4_ = fVar2 * fVar17 + auVar89._24_4_;
                  auVar88._28_4_ = fVar1 + auVar89._28_4_;
                  auVar89 = ZEXT3264(auVar88);
                  auVar84._0_4_ = fVar3 * fVar11 + auVar85._0_4_;
                  auVar84._4_4_ = fVar3 * fVar12 + auVar85._4_4_;
                  auVar84._8_4_ = fVar3 * fVar13 + auVar85._8_4_;
                  auVar84._12_4_ = fVar3 * fVar14 + auVar85._12_4_;
                  auVar84._16_4_ = fVar3 * fVar15 + auVar85._16_4_;
                  auVar84._20_4_ = fVar3 * fVar16 + auVar85._20_4_;
                  auVar84._24_4_ = fVar3 * fVar17 + auVar85._24_4_;
                  auVar84._28_4_ = fVar1 + auVar85._28_4_;
                  auVar85 = ZEXT3264(auVar84);
                  fVar2 = pfVar24[4];
                  fVar3 = pfVar24[5];
                  auVar80._0_4_ = fVar4 * fVar11 + auVar81._0_4_;
                  auVar80._4_4_ = fVar4 * fVar12 + auVar81._4_4_;
                  auVar80._8_4_ = fVar4 * fVar13 + auVar81._8_4_;
                  auVar80._12_4_ = fVar4 * fVar14 + auVar81._12_4_;
                  auVar80._16_4_ = fVar4 * fVar15 + auVar81._16_4_;
                  auVar80._20_4_ = fVar4 * fVar16 + auVar81._20_4_;
                  auVar80._24_4_ = fVar4 * fVar17 + auVar81._24_4_;
                  auVar80._28_4_ = fVar1 + auVar81._28_4_;
                  auVar81 = ZEXT3264(auVar80);
                  auVar76._0_4_ = fVar2 * fVar11 + auVar77._0_4_;
                  auVar76._4_4_ = fVar2 * fVar12 + auVar77._4_4_;
                  auVar76._8_4_ = fVar2 * fVar13 + auVar77._8_4_;
                  auVar76._12_4_ = fVar2 * fVar14 + auVar77._12_4_;
                  auVar76._16_4_ = fVar2 * fVar15 + auVar77._16_4_;
                  auVar76._20_4_ = fVar2 * fVar16 + auVar77._20_4_;
                  auVar76._24_4_ = fVar2 * fVar17 + auVar77._24_4_;
                  auVar76._28_4_ = fVar1 + auVar77._28_4_;
                  auVar77 = ZEXT3264(auVar76);
                  fVar2 = pfVar24[6];
                  fVar4 = pfVar24[7];
                  auVar69._0_4_ = fVar3 * fVar11 + auVar71._0_4_;
                  auVar69._4_4_ = fVar3 * fVar12 + auVar71._4_4_;
                  auVar69._8_4_ = fVar3 * fVar13 + auVar71._8_4_;
                  auVar69._12_4_ = fVar3 * fVar14 + auVar71._12_4_;
                  auVar69._16_4_ = fVar3 * fVar15 + auVar71._16_4_;
                  auVar69._20_4_ = fVar3 * fVar16 + auVar71._20_4_;
                  auVar69._24_4_ = fVar3 * fVar17 + auVar71._24_4_;
                  auVar69._28_4_ = fVar1 + auVar71._28_4_;
                  auVar71 = ZEXT3264(auVar69);
                  auVar64._0_4_ = fVar2 * fVar11 + auVar66._0_4_;
                  auVar64._4_4_ = fVar2 * fVar12 + auVar66._4_4_;
                  auVar64._8_4_ = fVar2 * fVar13 + auVar66._8_4_;
                  auVar64._12_4_ = fVar2 * fVar14 + auVar66._12_4_;
                  auVar64._16_4_ = fVar2 * fVar15 + auVar66._16_4_;
                  auVar64._20_4_ = fVar2 * fVar16 + auVar66._20_4_;
                  auVar64._24_4_ = fVar2 * fVar17 + auVar66._24_4_;
                  auVar64._28_4_ = fVar1 + auVar66._28_4_;
                  auVar66 = ZEXT3264(auVar64);
                  fVar2 = pfVar24[8];
                  fVar3 = pfVar24[9];
                  auVar60._0_4_ = fVar4 * fVar11 + auVar62._0_4_;
                  auVar60._4_4_ = fVar4 * fVar12 + auVar62._4_4_;
                  auVar60._8_4_ = fVar4 * fVar13 + auVar62._8_4_;
                  auVar60._12_4_ = fVar4 * fVar14 + auVar62._12_4_;
                  auVar60._16_4_ = fVar4 * fVar15 + auVar62._16_4_;
                  auVar60._20_4_ = fVar4 * fVar16 + auVar62._20_4_;
                  auVar60._24_4_ = fVar4 * fVar17 + auVar62._24_4_;
                  auVar60._28_4_ = fVar1 + auVar62._28_4_;
                  auVar62 = ZEXT3264(auVar60);
                  auVar56._0_4_ = fVar2 * fVar11 + auVar59._0_4_;
                  auVar56._4_4_ = fVar2 * fVar12 + auVar59._4_4_;
                  auVar56._8_4_ = fVar2 * fVar13 + auVar59._8_4_;
                  auVar56._12_4_ = fVar2 * fVar14 + auVar59._12_4_;
                  auVar56._16_4_ = fVar2 * fVar15 + auVar59._16_4_;
                  auVar56._20_4_ = fVar2 * fVar16 + auVar59._20_4_;
                  auVar56._24_4_ = fVar2 * fVar17 + auVar59._24_4_;
                  auVar56._28_4_ = fVar1 + auVar59._28_4_;
                  auVar59 = ZEXT3264(auVar56);
                  fVar2 = pfVar24[10];
                  fVar4 = pfVar24[0xb];
                  auVar52._0_4_ = fVar3 * fVar11 + auVar55._0_4_;
                  auVar52._4_4_ = fVar3 * fVar12 + auVar55._4_4_;
                  auVar52._8_4_ = fVar3 * fVar13 + auVar55._8_4_;
                  auVar52._12_4_ = fVar3 * fVar14 + auVar55._12_4_;
                  auVar52._16_4_ = fVar3 * fVar15 + auVar55._16_4_;
                  auVar52._20_4_ = fVar3 * fVar16 + auVar55._20_4_;
                  auVar52._24_4_ = fVar3 * fVar17 + auVar55._24_4_;
                  auVar52._28_4_ = fVar1 + auVar55._28_4_;
                  auVar55 = ZEXT3264(auVar52);
                  auVar46._0_4_ = fVar2 * fVar11 + auVar50._0_4_;
                  auVar46._4_4_ = fVar2 * fVar12 + auVar50._4_4_;
                  auVar46._8_4_ = fVar2 * fVar13 + auVar50._8_4_;
                  auVar46._12_4_ = fVar2 * fVar14 + auVar50._12_4_;
                  auVar46._16_4_ = fVar2 * fVar15 + auVar50._16_4_;
                  auVar46._20_4_ = fVar2 * fVar16 + auVar50._20_4_;
                  auVar46._24_4_ = fVar2 * fVar17 + auVar50._24_4_;
                  auVar46._28_4_ = fVar1 + auVar50._28_4_;
                  auVar50 = ZEXT3264(auVar46);
                  fVar37 = fVar4 * fVar11 + fVar37;
                  fVar38 = fVar4 * fVar12 + fVar38;
                  fVar39 = fVar4 * fVar13 + fVar39;
                  fVar40 = fVar4 * fVar14 + fVar40;
                  fVar41 = fVar4 * fVar15 + fVar41;
                  fVar42 = fVar4 * fVar16 + fVar42;
                  fVar43 = fVar4 * fVar17 + fVar43;
                  fVar44 = pfVar35[7] + fVar44;
                  pfVar24 = pfVar24 + 0xc;
                  pfVar35 = pfVar35 + 8;
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
              }
              *pauVar26 = auVar73;
              pauVar26[1] = auVar88;
              pauVar26[2] = auVar84;
              pauVar26[3] = auVar80;
              pauVar26[4] = auVar76;
              pauVar26[5] = auVar69;
              pauVar26[6] = auVar64;
              pauVar26[7] = auVar60;
              pauVar26[8] = auVar56;
              pauVar26[9] = auVar52;
              pauVar26[10] = auVar46;
              *(float *)pauVar26[0xb] = fVar37;
              *(float *)(pauVar26[0xb] + 4) = fVar38;
              *(float *)(pauVar26[0xb] + 8) = fVar39;
              *(float *)(pauVar26[0xb] + 0xc) = fVar40;
              *(float *)(pauVar26[0xb] + 0x10) = fVar41;
              *(float *)(pauVar26[0xb] + 0x14) = fVar42;
              *(float *)(pauVar26[0xb] + 0x18) = fVar43;
              *(float *)(pauVar26[0xb] + 0x1c) = fVar44;
              pauVar26 = pauVar26 + 0xc;
              uVar29 = uVar33 + 0xc;
              iVar18 = (int)uVar33;
              uVar33 = uVar29;
            } while (iVar18 + 0x17 < (int)_w);
          }
          uVar28 = (uint)uVar29;
          for (iVar18 = uVar28 + 7; iVar18 < (int)_w; iVar18 = iVar18 + 0xf) {
            iVar18 = (int)uVar29;
            if (iVar5 < 1) {
              auVar74 = SUB6432(ZEXT864(0),0);
              auVar70 = SUB6432(ZEXT864(0),0);
              auVar65 = SUB6432(ZEXT864(0),0);
              auVar61 = SUB6432(ZEXT864(0),0);
              auVar57 = SUB6432(ZEXT864(0),0);
              auVar53 = SUB6432(ZEXT864(0),0);
              auVar47 = SUB6432(ZEXT864(0),0);
              fVar37 = 0.0;
              fVar38 = 0.0;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
            }
            else {
              lVar21 = ((ulong)(((uint)(iVar18 + (int)((uVar29 & 0xffffffff) / 0xc) * -0xc) >> 3) +
                               (int)((uVar29 & 0xffffffff) / 0xc)) * lVar22 + lVar31) *
                       local_88._16_8_;
              fVar37 = 0.0;
              fVar38 = 0.0;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              lVar25 = 0;
              auVar50 = ZEXT864(0);
              auVar55 = ZEXT864(0);
              auVar59 = ZEXT864(0);
              auVar62 = ZEXT864(0);
              auVar66 = ZEXT864(0);
              auVar71 = ZEXT864(0);
              auVar75 = ZEXT864(0);
              iVar30 = iVar27;
              do {
                pfVar35 = (float *)((long)pvVar32 + lVar25);
                fVar3 = *pfVar35;
                fVar4 = pfVar35[1];
                fVar11 = pfVar35[2];
                fVar12 = pfVar35[3];
                fVar13 = pfVar35[4];
                fVar14 = pfVar35[5];
                fVar15 = pfVar35[6];
                fVar1 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar25 + lVar21);
                fVar2 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar25 + lVar21 + 4);
                auVar74._0_4_ = fVar1 * fVar3 + auVar75._0_4_;
                auVar74._4_4_ = fVar1 * fVar4 + auVar75._4_4_;
                auVar74._8_4_ = fVar1 * fVar11 + auVar75._8_4_;
                auVar74._12_4_ = fVar1 * fVar12 + auVar75._12_4_;
                auVar74._16_4_ = fVar1 * fVar13 + auVar75._16_4_;
                auVar74._20_4_ = fVar1 * fVar14 + auVar75._20_4_;
                auVar74._24_4_ = fVar1 * fVar15 + auVar75._24_4_;
                auVar74._28_4_ = fVar1 + auVar75._28_4_;
                auVar75 = ZEXT3264(auVar74);
                auVar70._0_4_ = fVar2 * fVar3 + auVar71._0_4_;
                auVar70._4_4_ = fVar2 * fVar4 + auVar71._4_4_;
                auVar70._8_4_ = fVar2 * fVar11 + auVar71._8_4_;
                auVar70._12_4_ = fVar2 * fVar12 + auVar71._12_4_;
                auVar70._16_4_ = fVar2 * fVar13 + auVar71._16_4_;
                auVar70._20_4_ = fVar2 * fVar14 + auVar71._20_4_;
                auVar70._24_4_ = fVar2 * fVar15 + auVar71._24_4_;
                auVar70._28_4_ = fVar1 + auVar71._28_4_;
                auVar71 = ZEXT3264(auVar70);
                fVar1 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 8))->_vptr_Allocator +
                                  lVar25 + lVar21);
                fVar2 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 8))->_vptr_Allocator +
                                  lVar25 + lVar21 + 4);
                auVar65._0_4_ = fVar1 * fVar3 + auVar66._0_4_;
                auVar65._4_4_ = fVar1 * fVar4 + auVar66._4_4_;
                auVar65._8_4_ = fVar1 * fVar11 + auVar66._8_4_;
                auVar65._12_4_ = fVar1 * fVar12 + auVar66._12_4_;
                auVar65._16_4_ = fVar1 * fVar13 + auVar66._16_4_;
                auVar65._20_4_ = fVar1 * fVar14 + auVar66._20_4_;
                auVar65._24_4_ = fVar1 * fVar15 + auVar66._24_4_;
                auVar65._28_4_ = fVar1 + auVar66._28_4_;
                auVar66 = ZEXT3264(auVar65);
                auVar61._0_4_ = fVar2 * fVar3 + auVar62._0_4_;
                auVar61._4_4_ = fVar2 * fVar4 + auVar62._4_4_;
                auVar61._8_4_ = fVar2 * fVar11 + auVar62._8_4_;
                auVar61._12_4_ = fVar2 * fVar12 + auVar62._12_4_;
                auVar61._16_4_ = fVar2 * fVar13 + auVar62._16_4_;
                auVar61._20_4_ = fVar2 * fVar14 + auVar62._20_4_;
                auVar61._24_4_ = fVar2 * fVar15 + auVar62._24_4_;
                auVar61._28_4_ = fVar1 + auVar62._28_4_;
                auVar62 = ZEXT3264(auVar61);
                fVar1 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 0x10))->_vptr_Allocator +
                                  lVar25 + lVar21);
                fVar2 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 0x10))->_vptr_Allocator +
                                  lVar25 + lVar21 + 4);
                auVar57._0_4_ = fVar1 * fVar3 + auVar59._0_4_;
                auVar57._4_4_ = fVar1 * fVar4 + auVar59._4_4_;
                auVar57._8_4_ = fVar1 * fVar11 + auVar59._8_4_;
                auVar57._12_4_ = fVar1 * fVar12 + auVar59._12_4_;
                auVar57._16_4_ = fVar1 * fVar13 + auVar59._16_4_;
                auVar57._20_4_ = fVar1 * fVar14 + auVar59._20_4_;
                auVar57._24_4_ = fVar1 * fVar15 + auVar59._24_4_;
                auVar57._28_4_ = fVar1 + auVar59._28_4_;
                auVar59 = ZEXT3264(auVar57);
                auVar53._0_4_ = fVar2 * fVar3 + auVar55._0_4_;
                auVar53._4_4_ = fVar2 * fVar4 + auVar55._4_4_;
                auVar53._8_4_ = fVar2 * fVar11 + auVar55._8_4_;
                auVar53._12_4_ = fVar2 * fVar12 + auVar55._12_4_;
                auVar53._16_4_ = fVar2 * fVar13 + auVar55._16_4_;
                auVar53._20_4_ = fVar2 * fVar14 + auVar55._20_4_;
                auVar53._24_4_ = fVar2 * fVar15 + auVar55._24_4_;
                auVar53._28_4_ = fVar1 + auVar55._28_4_;
                auVar55 = ZEXT3264(auVar53);
                fVar1 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 0x18))->_vptr_Allocator +
                                  lVar25 + lVar21);
                fVar2 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 0x18))->_vptr_Allocator +
                                  lVar25 + lVar21 + 4);
                auVar47._0_4_ = fVar1 * fVar3 + auVar50._0_4_;
                auVar47._4_4_ = fVar1 * fVar4 + auVar50._4_4_;
                auVar47._8_4_ = fVar1 * fVar11 + auVar50._8_4_;
                auVar47._12_4_ = fVar1 * fVar12 + auVar50._12_4_;
                auVar47._16_4_ = fVar1 * fVar13 + auVar50._16_4_;
                auVar47._20_4_ = fVar1 * fVar14 + auVar50._20_4_;
                auVar47._24_4_ = fVar1 * fVar15 + auVar50._24_4_;
                auVar47._28_4_ = fVar1 + auVar50._28_4_;
                auVar50 = ZEXT3264(auVar47);
                fVar37 = fVar2 * fVar3 + fVar37;
                fVar38 = fVar2 * fVar4 + fVar38;
                fVar39 = fVar2 * fVar11 + fVar39;
                fVar40 = fVar2 * fVar12 + fVar40;
                fVar41 = fVar2 * fVar13 + fVar41;
                fVar42 = fVar2 * fVar14 + fVar42;
                fVar43 = fVar2 * fVar15 + fVar43;
                fVar44 = pfVar35[7] + fVar44;
                lVar25 = lVar25 + 0x20;
                iVar30 = iVar30 + -1;
              } while (iVar30 != 0);
            }
            *pauVar26 = auVar74;
            pauVar26[1] = auVar70;
            pauVar26[2] = auVar65;
            pauVar26[3] = auVar61;
            pauVar26[4] = auVar57;
            pauVar26[5] = auVar53;
            pauVar26[6] = auVar47;
            *(float *)pauVar26[7] = fVar37;
            *(float *)(pauVar26[7] + 4) = fVar38;
            *(float *)(pauVar26[7] + 8) = fVar39;
            *(float *)(pauVar26[7] + 0xc) = fVar40;
            *(float *)(pauVar26[7] + 0x10) = fVar41;
            *(float *)(pauVar26[7] + 0x14) = fVar42;
            *(float *)(pauVar26[7] + 0x18) = fVar43;
            *(float *)(pauVar26[7] + 0x1c) = fVar44;
            pauVar26 = pauVar26 + 8;
            uVar28 = iVar18 + 8;
            uVar29 = (ulong)uVar28;
          }
          uVar19 = uVar28 | 3;
          while ((int)uVar19 < (int)_w) {
            if (iVar5 < 1) {
              auVar58 = SUB6432(ZEXT864(0),0);
              auVar54 = SUB6432(ZEXT864(0),0);
              auVar48 = SUB6432(ZEXT864(0),0);
              fVar37 = 0.0;
              fVar38 = 0.0;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
            }
            else {
              lVar21 = ((ulong)((uVar28 % 0xc >> 3) + uVar28 / 0xc +
                               (uint)((uVar28 % 0xc >> 2 & 1) != 0)) * lVar22 + lVar31) *
                       local_88._16_8_;
              fVar37 = 0.0;
              fVar38 = 0.0;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              lVar25 = 0;
              auVar50 = ZEXT864(0);
              auVar55 = ZEXT864(0);
              auVar59 = ZEXT864(0);
              iVar18 = iVar27;
              do {
                pfVar35 = (float *)((long)pvVar32 + lVar25 * 2);
                fVar3 = *pfVar35;
                fVar4 = pfVar35[1];
                fVar11 = pfVar35[2];
                fVar12 = pfVar35[3];
                fVar13 = pfVar35[4];
                fVar14 = pfVar35[5];
                fVar15 = pfVar35[6];
                fVar1 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar25 + lVar21);
                fVar2 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar25 + lVar21 + 4);
                auVar58._0_4_ = fVar1 * fVar3 + auVar59._0_4_;
                auVar58._4_4_ = fVar1 * fVar4 + auVar59._4_4_;
                auVar58._8_4_ = fVar1 * fVar11 + auVar59._8_4_;
                auVar58._12_4_ = fVar1 * fVar12 + auVar59._12_4_;
                auVar58._16_4_ = fVar1 * fVar13 + auVar59._16_4_;
                auVar58._20_4_ = fVar1 * fVar14 + auVar59._20_4_;
                auVar58._24_4_ = fVar1 * fVar15 + auVar59._24_4_;
                auVar58._28_4_ = fVar1 + auVar59._28_4_;
                auVar59 = ZEXT3264(auVar58);
                auVar54._0_4_ = fVar2 * fVar3 + auVar55._0_4_;
                auVar54._4_4_ = fVar2 * fVar4 + auVar55._4_4_;
                auVar54._8_4_ = fVar2 * fVar11 + auVar55._8_4_;
                auVar54._12_4_ = fVar2 * fVar12 + auVar55._12_4_;
                auVar54._16_4_ = fVar2 * fVar13 + auVar55._16_4_;
                auVar54._20_4_ = fVar2 * fVar14 + auVar55._20_4_;
                auVar54._24_4_ = fVar2 * fVar15 + auVar55._24_4_;
                auVar54._28_4_ = fVar1 + auVar55._28_4_;
                auVar55 = ZEXT3264(auVar54);
                fVar1 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 8))->_vptr_Allocator +
                                  lVar25 + lVar21);
                fVar2 = *(float *)((long)&((Allocator *)(local_88._0_8_ + 8))->_vptr_Allocator +
                                  lVar25 + lVar21 + 4);
                auVar48._0_4_ = fVar1 * fVar3 + auVar50._0_4_;
                auVar48._4_4_ = fVar1 * fVar4 + auVar50._4_4_;
                auVar48._8_4_ = fVar1 * fVar11 + auVar50._8_4_;
                auVar48._12_4_ = fVar1 * fVar12 + auVar50._12_4_;
                auVar48._16_4_ = fVar1 * fVar13 + auVar50._16_4_;
                auVar48._20_4_ = fVar1 * fVar14 + auVar50._20_4_;
                auVar48._24_4_ = fVar1 * fVar15 + auVar50._24_4_;
                auVar48._28_4_ = fVar1 + auVar50._28_4_;
                auVar50 = ZEXT3264(auVar48);
                fVar37 = fVar2 * fVar3 + fVar37;
                fVar38 = fVar2 * fVar4 + fVar38;
                fVar39 = fVar2 * fVar11 + fVar39;
                fVar40 = fVar2 * fVar12 + fVar40;
                fVar41 = fVar2 * fVar13 + fVar41;
                fVar42 = fVar2 * fVar14 + fVar42;
                fVar43 = fVar2 * fVar15 + fVar43;
                fVar44 = pfVar35[7] + fVar44;
                lVar25 = lVar25 + 0x10;
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
            }
            *pauVar26 = auVar58;
            pauVar26[1] = auVar54;
            pauVar26[2] = auVar48;
            *(float *)pauVar26[3] = fVar37;
            *(float *)(pauVar26[3] + 4) = fVar38;
            *(float *)(pauVar26[3] + 8) = fVar39;
            *(float *)(pauVar26[3] + 0xc) = fVar40;
            *(float *)(pauVar26[3] + 0x10) = fVar41;
            *(float *)(pauVar26[3] + 0x14) = fVar42;
            *(float *)(pauVar26[3] + 0x18) = fVar43;
            *(float *)(pauVar26[3] + 0x1c) = fVar44;
            pauVar26 = pauVar26 + 4;
            uVar19 = uVar28 + 7;
            uVar28 = uVar28 + 4;
          }
          uVar19 = uVar28 | 1;
          while ((int)uVar19 < (int)_w) {
            uVar19 = uVar28 % 0xc;
            if (iVar5 < 1) {
              auVar49 = SUB6432(ZEXT864(0),0);
              fVar37 = 0.0;
              fVar38 = 0.0;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
            }
            else {
              lVar21 = ((ulong)((uVar19 >> 2 & 1) + (uVar19 >> 3) + uVar28 / 0xc +
                               (uint)((uVar19 >> 1 & 1) != 0)) * lVar22 + lVar31) * local_88._16_8_;
              fVar37 = 0.0;
              fVar38 = 0.0;
              fVar39 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              lVar25 = 0;
              auVar50 = ZEXT864(0);
              iVar18 = iVar27;
              do {
                pfVar35 = (float *)((long)pvVar32 + lVar25 * 4);
                fVar1 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar25 + lVar21);
                fVar2 = *(float *)((long)(_func_int ***)local_88._0_8_ + lVar25 + lVar21 + 4);
                auVar49._0_4_ = fVar1 * *pfVar35 + auVar50._0_4_;
                auVar49._4_4_ = fVar1 * pfVar35[1] + auVar50._4_4_;
                auVar49._8_4_ = fVar1 * pfVar35[2] + auVar50._8_4_;
                auVar49._12_4_ = fVar1 * pfVar35[3] + auVar50._12_4_;
                auVar49._16_4_ = fVar1 * pfVar35[4] + auVar50._16_4_;
                auVar49._20_4_ = fVar1 * pfVar35[5] + auVar50._20_4_;
                auVar49._24_4_ = fVar1 * pfVar35[6] + auVar50._24_4_;
                auVar49._28_4_ = fVar1 + auVar50._28_4_;
                auVar50 = ZEXT3264(auVar49);
                fVar37 = fVar2 * *pfVar35 + fVar37;
                fVar38 = fVar2 * pfVar35[1] + fVar38;
                fVar39 = fVar2 * pfVar35[2] + fVar39;
                fVar40 = fVar2 * pfVar35[3] + fVar40;
                fVar41 = fVar2 * pfVar35[4] + fVar41;
                fVar42 = fVar2 * pfVar35[5] + fVar42;
                fVar43 = fVar2 * pfVar35[6] + fVar43;
                fVar44 = pfVar35[7] + fVar44;
                lVar25 = lVar25 + 8;
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
            }
            *pauVar26 = auVar49;
            *(float *)pauVar26[1] = fVar37;
            *(float *)(pauVar26[1] + 4) = fVar38;
            *(float *)(pauVar26[1] + 8) = fVar39;
            *(float *)(pauVar26[1] + 0xc) = fVar40;
            *(float *)(pauVar26[1] + 0x10) = fVar41;
            *(float *)(pauVar26[1] + 0x14) = fVar42;
            *(float *)(pauVar26[1] + 0x18) = fVar43;
            *(float *)(pauVar26[1] + 0x1c) = fVar44;
            pauVar26 = pauVar26 + 2;
            uVar19 = uVar28 + 3;
            uVar28 = uVar28 + 2;
          }
          if ((int)uVar28 < (int)_w) {
            do {
              uVar19 = uVar28 % 0xc;
              if (iVar5 < 1) {
                fVar37 = 0.0;
                fVar38 = 0.0;
                fVar39 = 0.0;
                fVar40 = 0.0;
                fVar41 = 0.0;
                fVar42 = 0.0;
                fVar43 = 0.0;
                fVar44 = 0.0;
              }
              else {
                fVar37 = 0.0;
                fVar38 = 0.0;
                fVar39 = 0.0;
                fVar40 = 0.0;
                fVar41 = 0.0;
                fVar42 = 0.0;
                fVar43 = 0.0;
                fVar44 = 0.0;
                lVar21 = 0;
                iVar18 = iVar27;
                do {
                  fVar1 = *(float *)((long)(_func_int ***)local_88._0_8_ +
                                    lVar21 + ((ulong)((uVar19 >> 2 & 1) +
                                                      (uVar28 & 1) + uVar28 / 0xc + (uVar19 >> 3) +
                                                     (uint)((uVar19 >> 1 & 1) != 0)) * lVar22 +
                                             lVar31) * local_88._16_8_);
                  pfVar35 = (float *)((long)pvVar32 + lVar21 * 8);
                  fVar37 = fVar1 * *pfVar35 + fVar37;
                  fVar38 = fVar1 * pfVar35[1] + fVar38;
                  fVar39 = fVar1 * pfVar35[2] + fVar39;
                  fVar40 = fVar1 * pfVar35[3] + fVar40;
                  fVar41 = fVar1 * pfVar35[4] + fVar41;
                  fVar42 = fVar1 * pfVar35[5] + fVar42;
                  fVar43 = fVar1 * pfVar35[6] + fVar43;
                  fVar44 = fVar1 + fVar44;
                  lVar21 = lVar21 + 4;
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
              }
              *(float *)*pauVar26 = fVar37;
              *(float *)((long)*pauVar26 + 4) = fVar38;
              *(float *)((long)*pauVar26 + 8) = fVar39;
              *(float *)((long)*pauVar26 + 0xc) = fVar40;
              *(float *)((long)*pauVar26 + 0x10) = fVar41;
              *(float *)((long)*pauVar26 + 0x14) = fVar42;
              *(float *)((long)*pauVar26 + 0x18) = fVar43;
              *(float *)((long)*pauVar26 + 0x1c) = fVar44;
              pauVar26 = pauVar26 + 1;
              uVar28 = uVar28 + 1;
            } while (uVar28 != _w);
          }
          uVar36 = uVar36 + 1;
          pvVar32 = (void *)((long)pvVar32 + lVar20);
        } while (uVar36 != _c);
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != local_38);
  }
  piVar6 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_88._0_8_ != (Allocator *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_88._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_winograd_dot_pack8_avx(Mat& bottom_blob_tm, int outch, const Mat& kernel_tm, Mat& top_blob_tm, const Option& opt)
{
    // Mat bottom_blob_tm(tiles, 16/36/64, inch, 32u, 4, opt.workspace_allocator);

    const int tiles = bottom_blob_tm.w;
    const int batch = bottom_blob_tm.h;
    const int inch = bottom_blob_tm.c;

    // permute
    Mat bottom_blob_tm2;
    if (tiles >= 12)
        bottom_blob_tm2.create(12 * inch, tiles / 12 + (tiles % 12) / 8 + (tiles % 12 % 8) / 4 + (tiles % 12 % 4) / 2 + tiles % 12 % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 8)
        bottom_blob_tm2.create(8 * inch, tiles / 8 + (tiles % 8) / 4 + (tiles % 4) / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 4)
        bottom_blob_tm2.create(4 * inch, tiles / 4 + (tiles % 4) / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 2)
        bottom_blob_tm2.create(2 * inch, tiles / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else // if (tiles >= 1)
        bottom_blob_tm2.create(1 * inch, tiles, batch, 32u, 8, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int r = 0; r < batch; r++)
    {
        Mat tm2 = bottom_blob_tm2.channel(r);

        // tile
        int i = 0;

        for (; i + 11 < tiles; i += 12)
        {
            float* tmpptr = tm2.row(i / 12);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x12
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(r0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(r0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(r0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(r0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(r0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(r0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(r0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(r0 + 8 * 11);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                __m256 _tmp8 = _mm256_unpacklo_ps(_r8, _r9);
                __m256 _tmp9 = _mm256_unpackhi_ps(_r8, _r9);
                __m256 _tmpa = _mm256_unpacklo_ps(_ra, _rb);
                __m256 _tmpb = _mm256_unpackhi_ps(_ra, _rb);
                __m256 _tmpc = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpd = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpe = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpf = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpg = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmph = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpi = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpj = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpk = _mm256_shuffle_ps(_tmp8, _tmpa, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpl = _mm256_shuffle_ps(_tmp8, _tmpa, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpm = _mm256_shuffle_ps(_tmp9, _tmpb, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpn = _mm256_shuffle_ps(_tmp9, _tmpb, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmpc, _tmpg, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmpk, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmph, _tmpl, _MM_SHUFFLE(0, 2, 0, 0));
                _r3 = _mm256_permute2f128_ps(_tmpe, _tmpi, _MM_SHUFFLE(0, 2, 0, 0));
                _r4 = _mm256_permute2f128_ps(_tmpm, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                _r5 = _mm256_permute2f128_ps(_tmpj, _tmpn, _MM_SHUFFLE(0, 2, 0, 0));
                _r6 = _mm256_permute2f128_ps(_tmpc, _tmpg, _MM_SHUFFLE(0, 3, 0, 1));
                _r7 = _mm256_permute2f128_ps(_tmpk, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                _r8 = _mm256_permute2f128_ps(_tmph, _tmpl, _MM_SHUFFLE(0, 3, 0, 1));
                _r9 = _mm256_permute2f128_ps(_tmpe, _tmpi, _MM_SHUFFLE(0, 3, 0, 1));
                _ra = _mm256_permute2f128_ps(_tmpm, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));
                _rb = _mm256_permute2f128_ps(_tmpj, _tmpn, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);
                _mm256_store_ps(tmpptr + 8 * 4, _r4);
                _mm256_store_ps(tmpptr + 8 * 5, _r5);
                _mm256_store_ps(tmpptr + 8 * 6, _r6);
                _mm256_store_ps(tmpptr + 8 * 7, _r7);
                _mm256_store_ps(tmpptr + 8 * 8, _r8);
                _mm256_store_ps(tmpptr + 8 * 9, _r9);
                _mm256_store_ps(tmpptr + 8 * 10, _ra);
                _mm256_store_ps(tmpptr + 8 * 11, _rb);

                tmpptr += 96;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 7 < tiles; i += 8)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x8
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(r0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(r0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(r0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(r0 + 8 * 7);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);
                _mm256_store_ps(tmpptr + 8 * 4, _r4);
                _mm256_store_ps(tmpptr + 8 * 5, _r5);
                _mm256_store_ps(tmpptr + 8 * 6, _r6);
                _mm256_store_ps(tmpptr + 8 * 7, _r7);

                tmpptr += 64;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 3 < tiles; i += 4)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x4
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp5 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmp6 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp7 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 3, 0, 1));
                _r3 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);

                tmpptr += 32;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 1 < tiles; i += 2)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x2
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                _r0 = _mm256_permute2f128_ps(_tmp0, _tmp1, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp0, _tmp1, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);

                tmpptr += 16;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }

        for (; i < tiles; i++)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);

            const float* r0 = bottom_blob_tm;
            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                __m256 _val = _mm256_load_ps(r0);
                _mm256_store_ps(tmpptr, _val);

                tmpptr += 8;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
    }

    bottom_blob_tm = Mat();
    // permute end

    top_blob_tm.create(tiles, batch, outch, 32u, 8, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* output0_tm = top_blob_tm.channel(p);

        const Mat kernel0_tm = kernel_tm.channel(p);

        for (int r = 0; r < batch; r++)
        {
            const Mat bb2 = bottom_blob_tm2.channel(r);

            int i = 0;
            for (; i + 11 < tiles; i += 12)
            {
                const float* r0 = bb2.row(i / 12);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();
                __m256 _sum4 = _mm256_setzero_ps();
                __m256 _sum5 = _mm256_setzero_ps();
                __m256 _sum6 = _mm256_setzero_ps();
                __m256 _sum7 = _mm256_setzero_ps();
                __m256 _sum8 = _mm256_setzero_ps();
                __m256 _sum9 = _mm256_setzero_ps();
                __m256 _suma = _mm256_setzero_ps();
                __m256 _sumb = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                    __m256 _val4 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _val5 = _mm256_broadcast_ss(r0 + 5);
                    _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                    __m256 _val6 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _val7 = _mm256_broadcast_ss(r0 + 7);
                    _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);
                    __m256 _val8 = _mm256_broadcast_ss(r0 + 8);
                    __m256 _val9 = _mm256_broadcast_ss(r0 + 9);
                    _sum8 = _mm256_comp_fmadd_ps(_val8, _w0, _sum8);
                    _sum9 = _mm256_comp_fmadd_ps(_val9, _w0, _sum9);
                    __m256 _vala = _mm256_broadcast_ss(r0 + 10);
                    __m256 _valb = _mm256_broadcast_ss(r0 + 11);
                    _suma = _mm256_comp_fmadd_ps(_vala, _w0, _suma);
                    _sumb = _mm256_comp_fmadd_ps(_valb, _w0, _sumb);

                    r0 += 12;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);
                _mm256_store_ps(output0_tm + 8 * 4, _sum4);
                _mm256_store_ps(output0_tm + 8 * 5, _sum5);
                _mm256_store_ps(output0_tm + 8 * 6, _sum6);
                _mm256_store_ps(output0_tm + 8 * 7, _sum7);
                _mm256_store_ps(output0_tm + 8 * 8, _sum8);
                _mm256_store_ps(output0_tm + 8 * 9, _sum9);
                _mm256_store_ps(output0_tm + 8 * 10, _suma);
                _mm256_store_ps(output0_tm + 8 * 11, _sumb);

                output0_tm += 8 * 12;
            }
            for (; i + 7 < tiles; i += 8)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();
                __m256 _sum4 = _mm256_setzero_ps();
                __m256 _sum5 = _mm256_setzero_ps();
                __m256 _sum6 = _mm256_setzero_ps();
                __m256 _sum7 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                    __m256 _val4 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _val5 = _mm256_broadcast_ss(r0 + 5);
                    _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                    __m256 _val6 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _val7 = _mm256_broadcast_ss(r0 + 7);
                    _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                    r0 += 8;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);
                _mm256_store_ps(output0_tm + 8 * 4, _sum4);
                _mm256_store_ps(output0_tm + 8 * 5, _sum5);
                _mm256_store_ps(output0_tm + 8 * 6, _sum6);
                _mm256_store_ps(output0_tm + 8 * 7, _sum7);

                output0_tm += 8 * 8;
            }
            for (; i + 3 < tiles; i += 4)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);

                    r0 += 4;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);

                output0_tm += 8 * 4;
            }
            for (; i + 1 < tiles; i += 2)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);

                    r0 += 2;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);

                output0_tm += 8 * 2;
            }

            for (; i < tiles; i++)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);
                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                    r0 += 1;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);

                output0_tm += 8;
            }
        }
    }
}